

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void>::visit
          (ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void> *this,Arg *arg)

{
  switch(arg->type) {
  case INT:
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::visit_any_int<int>
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *)this,
               (arg->super_Value).field_0.int_value);
    return;
  case UINT:
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::
    visit_any_int<unsigned_int>
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *)this,
               (arg->super_Value).field_0.uint_value);
    return;
  case LONG_LONG:
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::
    visit_any_int<long_long>
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *)this,
               (arg->super_Value).field_0.long_long_value);
    return;
  case ULONG_LONG:
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::
    visit_any_int<unsigned_long_long>
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *)this,
               (arg->super_Value).field_0.ulong_long_value);
    return;
  case BOOL:
    internal::PrintfArgFormatter<char>::visit_bool
              ((PrintfArgFormatter<char> *)this,(arg->super_Value).field_0.int_value != 0);
    return;
  case CHAR:
    internal::PrintfArgFormatter<char>::visit_char
              ((PrintfArgFormatter<char> *)this,(arg->super_Value).field_0.int_value);
    return;
  case DOUBLE:
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::
    visit_any_double<double>
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *)this,
               (arg->super_Value).field_0.double_value);
    return;
  case LAST_NUMERIC_TYPE:
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::
    visit_any_double<long_double>
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *)this,
               (arg->super_Value).field_0.long_double_value);
    return;
  case CSTRING:
    internal::PrintfArgFormatter<char>::visit_cstring
              ((PrintfArgFormatter<char> *)this,(arg->super_Value).field_0.string.value);
    return;
  case STRING:
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::visit_string
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *)this,
               (arg->super_Value).field_0.string);
    return;
  default:
    return;
  case POINTER:
    internal::PrintfArgFormatter<char>::visit_pointer
              ((PrintfArgFormatter<char> *)this,(arg->super_Value).field_0.pointer);
    return;
  case CUSTOM:
    internal::PrintfArgFormatter<char>::visit_custom
              ((PrintfArgFormatter<char> *)this,(arg->super_Value).field_0.custom);
    return;
  }
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    case Arg::NONE:
    case Arg::NAMED_ARG:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
    return Result();
  }